

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

void __thiscall Color::upgrade(Color *this)

{
  unsigned_long uVar1;
  ulong uVar2;
  uint uVar3;
  int local_2c;
  uint bg;
  bool bright;
  uint fg;
  Color *this_local;
  
  if (((this->_value & 0x20000000) == 0) && ((this->_value & 0x80000000) == 0)) {
    if ((this->_value & 0x8000000) != 0) {
      uVar1 = this->_value;
      this->_value = this->_value & 0xffffffffffffff00;
      this->_value = (ulong)(((uint)uVar1 & 0xff) - 1) | this->_value;
    }
    if ((this->_value & 0x10000000) != 0) {
      uVar2 = this->_value;
      uVar3 = (uint)(this->_value >> 8) & 0xff;
      this->_value = this->_value & 0xffffffffffff00ff;
      this->_value = this->_value & 0xfffffffffeffffff;
      if ((uVar2 & 0x1000000) == 0) {
        local_2c = uVar3 - 1;
      }
      else {
        local_2c = uVar3 + 7;
      }
      this->_value = (ulong)(uint)(local_2c << 8) | this->_value;
    }
    this->_value = this->_value | 0x20000000;
  }
  return;
}

Assistant:

void Color::upgrade ()
{
  if ((_value & _COLOR_256) ||
      (_value & _COLOR_24BIT)) return;

  if (_value & _COLOR_HASFG)
  {
    unsigned int fg = _value & _COLOR_FG;
    _value &= ~_COLOR_FG;
    _value |= fg - 1;
  }

  if (_value & _COLOR_HASBG)
  {
    bool bright = _value & _COLOR_BRIGHT;
    unsigned int bg = (_value & _COLOR_BG) >> 8;
    _value &= ~_COLOR_BG;
    _value &= ~_COLOR_BRIGHT;
    _value |= (bright ? bg + 7 : bg - 1) << 8;
  }

  _value |= _COLOR_256;
}